

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
::proxy_dispatcher_template_t
          (proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
           *this,disp_params_t *disp_params)

{
  disp_params_t *disp_params_local;
  proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
  *this_local;
  
  one_thread::impl::actual_disp_iface_t::actual_disp_iface_t(&this->super_actual_disp_iface_t);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__proxy_dispatcher_template_t_005c3ad0;
  std::
  unique_ptr<so_5::disp::one_thread::impl::actual_disp_iface_t,std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>>
  ::unique_ptr<std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>,void>
            ((unique_ptr<so_5::disp::one_thread::impl::actual_disp_iface_t,std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>>
              *)&this->m_disp);
  one_thread::disp_params_t::disp_params_t(&this->m_disp_params,disp_params);
  std::__cxx11::string::string((string *)&this->m_data_source_base_name);
  return;
}

Assistant:

proxy_dispatcher_template_t( DISP_PARAMS_TYPE disp_params )
			:	m_disp_params( std::move(disp_params) )
			{}